

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.h
# Opt level: O0

int __thiscall
TPZMatrix<long_double>::Put(TPZMatrix<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  
  iVar1 = (**(code **)(*in_RDI + 0x118))(in_RDI,in_RSI,in_RDX,in_RCX);
  return iVar1;
}

Assistant:

inline int TPZMatrix<TVar>::Put(const int64_t row,const int64_t col,const TVar & value ) {
	// bound checking
#ifdef PZDEBUG
	if ( row >= Rows() || col >= Cols() || row <0 || col < 0 ) {
		std::stringstream sout;
		sout << "TPZMatrix<TVar>::Put" << " Index out of range row = " << row << " col = " << col << " Rows() " << Rows() << " Cols() " << Cols() << std::endl;
		Error(sout.str().c_str());
	}
#endif
	
	return( PutVal( row, col, value ) );
}